

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpEvaluate_Lagrange
              (ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tau,int deriv,int degree,
              N_Vector yout)

{
  double *pdVar1;
  undefined8 *puVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  ARKInterp in_RSI;
  ARKodeMem in_RDI;
  undefined8 in_R8;
  double in_XMM0_Qa;
  sunrealtype sVar4;
  N_Vector *yhist;
  sunrealtype *thist;
  int nhist;
  N_Vector X [6];
  sunrealtype a [6];
  sunrealtype tval;
  int j;
  int i;
  int retval;
  int q;
  int local_c8;
  int local_c4;
  undefined8 local_a8 [6];
  sunrealtype local_78 [6];
  sunrealtype local_48;
  int local_40;
  int local_3c;
  int local_34;
  undefined8 local_30;
  int local_24;
  ARKInterp local_18;
  int local_4;
  
  local_c8 = *(int *)((long)in_RSI->content + 0x18);
  pdVar1 = *(double **)((long)in_RSI->content + 0x10);
  puVar2 = *(undefined8 **)((long)in_RSI->content + 8);
  local_c4 = in_ECX;
  if (in_ECX < 1) {
    local_c4 = 0;
  }
  if (local_c4 < local_c8 + -1) {
    local_c8 = local_c4;
  }
  else {
    local_c8 = local_c8 + -1;
  }
  local_34 = local_c8;
  if ((in_EDX < 0) || (3 < in_EDX)) {
    arkProcessError(in_RDI,-0x16,0x4ba,"arkInterpEvaluate_Lagrange",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_interp.c"
                    ,"Requested illegal derivative.");
    local_4 = -0x16;
  }
  else if (local_c8 < in_EDX) {
    N_VConst(0,in_R8);
    local_4 = 0;
  }
  else if (local_c8 == 0) {
    N_VScale(0x3ff0000000000000,*puVar2,in_R8);
    local_4 = 0;
  }
  else {
    local_48 = in_XMM0_Qa * (*pdVar1 - pdVar1[1]) + *pdVar1;
    local_30 = in_R8;
    local_18 = in_RSI;
    if (local_c8 == 1) {
      if (in_EDX == 0) {
        local_78[0] = LBasis(in_RSI,0,local_48);
        local_78[1] = LBasis(local_18,1,local_48);
      }
      else {
        local_78[0] = LBasisD(in_RSI,0,local_48);
        local_78[1] = LBasisD(local_18,1,local_48);
      }
      N_VLinearSum(local_78[0],local_78[1],*puVar2,puVar2[1],local_30);
      local_4 = 0;
    }
    else {
      local_24 = in_EDX;
      for (local_3c = 0; local_3c < local_34 + 1; local_3c = local_3c + 1) {
        local_78[local_3c] = 0.0;
        local_a8[local_3c] = puVar2[local_3c];
      }
      switch(local_24) {
      case 0:
        for (local_40 = 0; local_40 < local_34 + 1; local_40 = local_40 + 1) {
          sVar4 = LBasis(local_18,local_40,local_48);
          local_78[local_40] = sVar4;
        }
        break;
      case 1:
        for (local_40 = 0; local_40 < local_34 + 1; local_40 = local_40 + 1) {
          sVar4 = LBasisD(local_18,local_40,local_48);
          local_78[local_40] = sVar4;
        }
        break;
      case 2:
        for (local_40 = 0; local_40 < local_34 + 1; local_40 = local_40 + 1) {
          sVar4 = LBasisD2(local_18,local_40,local_48);
          local_78[local_40] = sVar4;
        }
        break;
      case 3:
        for (local_40 = 0; local_40 < local_34 + 1; local_40 = local_40 + 1) {
          sVar4 = LBasisD3(local_18,local_40,local_48);
          local_78[local_40] = sVar4;
        }
      }
      iVar3 = N_VLinearCombination(local_34 + 1,local_78,local_a8,local_30);
      if (iVar3 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
  }
  return local_4;
}

Assistant:

int arkInterpEvaluate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tau,
                               int deriv, int degree, N_Vector yout)
{
  /* local variables */
  int q, retval, i, j;
  sunrealtype tval;
  sunrealtype a[6];
  N_Vector X[6];
  int nhist;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* determine polynomial degree q */
  q = SUNMAX(degree, 0);    /* respect lower bound */
  q = SUNMIN(q, nhist - 1); /* respect max possible */

  SUNLogDebug(ARK_LOGGER, "interp-eval",
              "tau = " SUN_FORMAT_G ", d = %i, q = %i", tau, deriv, q);

  /* error on illegal deriv */
  if ((deriv < 0) || (deriv > 3))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if deriv is too high, just return zeros */
  if (deriv > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* if constant interpolant is requested, just return ynew */
  if (q == 0)
  {
    N_VScale(ONE, yhist[0], yout);
    return (ARK_SUCCESS);
  }

  /* convert from tau back to t (both tnew and told are valid since q>0 => NHIST>1) */
  tval = thist[0] + tau * (thist[0] - thist[1]);

  /* linear interpolant */
  if (q == 1)
  {
    if (deriv == 0)
    {
      a[0] = LBasis(I, 0, tval);
      a[1] = LBasis(I, 1, tval);
    }
    else
    { /* deriv == 1 */
      a[0] = LBasisD(I, 0, tval);
      a[1] = LBasisD(I, 1, tval);
    }
    N_VLinearSum(a[0], yhist[0], a[1], yhist[1], yout);
    return (ARK_SUCCESS);
  }

  /* higher-degree interpolant */
  /*    initialize arguments for N_VLinearCombination */
  for (i = 0; i < q + 1; i++)
  {
    a[i] = ZERO;
    X[i] = yhist[i];
  }

  /*    construct linear combination coefficients based on derivative requested */
  switch (deriv)
  {
  case (0): /* p(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasis(I, j, tval); }
    break;

  case (1): /* p'(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD(I, j, tval); }
    break;

  case (2): /* p''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD2(I, j, tval); }
    break;

  case (3): /* p'''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD3(I, j, tval); }
    break;
  }

  /*    call N_VLinearCombination to evaluate the result, and return */
  retval = N_VLinearCombination(q + 1, a, X, yout);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  return (ARK_SUCCESS);
}